

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O1

void Omega_h::gmsh::anon_unknown_0::read_internal(istream *stream,Mesh *mesh)

{
  ClassSets *pCVar1;
  byte *pbVar2;
  _Rb_tree_header *p_Var3;
  byte bVar4;
  pair<int,_int> pVar5;
  iterator iVar6;
  pointer piVar7;
  void *pvVar8;
  uint __val;
  Alloc *pAVar9;
  _Base_ptr p_Var10;
  pointer pVVar11;
  uint uVar12;
  bool bVar13;
  char cVar14;
  uint uVar15;
  uint uVar16;
  istream *piVar17;
  istream *piVar18;
  vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *pvVar19;
  mapped_type *pmVar20;
  HostWrite<int> *val;
  _Base_ptr p_Var21;
  undefined8 uVar22;
  undefined8 *puVar23;
  ulong uVar24;
  pointer pVVar25;
  uint *__n;
  undefined7 uVar27;
  undefined1 *puVar26;
  LOs *ev2v;
  Read<signed_char> *this;
  _Rb_tree_header *p_Var28;
  int *piVar29;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  pointer __buf;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  int iVar30;
  int iVar31;
  char *pcVar32;
  ulong uVar33;
  Int j;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  uint __len;
  long lVar37;
  vector<int,std::allocator<int>> *this_00;
  int iVar38;
  LO size_in;
  pointer ppVar39;
  byte *pbVar40;
  ulong uVar41;
  byte *pbVar42;
  bool bVar43;
  initializer_list<std::pair<int,_int>_> __l;
  int node_number;
  Int physical_1;
  int nnodes;
  I32 physical_2;
  I32 elementary;
  Int physical;
  Int num_volumes;
  vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_> node_coords;
  HostWrite<double> host_coords;
  I32 ignored;
  Real format;
  int one;
  Int data_size;
  array<std::vector<int,_std::allocator<int>_>,_4UL> ent_nodes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  physical_names;
  array<std::vector<int,_std::allocator<int>_>,_4UL> ent_class_ids;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> node_number_map;
  Int file_type;
  uint local_35c;
  istream *local_358;
  ClassSets *local_350;
  uint local_344;
  int local_340;
  Omega_h_Family local_33c;
  int local_338;
  int local_334;
  HostWrite<int> local_330;
  HostWrite<int> local_320;
  pointer local_310;
  vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_> local_308;
  undefined1 local_2e8 [32];
  int local_2c8;
  int local_2c4;
  Mesh *local_2c0;
  double local_2b8;
  undefined1 local_2b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0 [2];
  undefined8 auStack_280 [22];
  char *local_1d0;
  _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_1c8;
  undefined8 uStack_1c0;
  vector<int,_std::allocator<int>_> local_1b8;
  long lStack_1a0;
  long local_198;
  undefined8 uStack_190;
  long local_188;
  long lStack_180;
  undefined8 local_178;
  long lStack_170;
  long local_168;
  undefined8 uStack_160;
  LOs local_158;
  LOs local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  long lStack_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_b8;
  uint local_84;
  Write<int> local_80;
  Read<signed_char> local_70;
  Write<double> local_60;
  Read<signed_char> local_50;
  Write<int> local_40;
  
  local_2b0._0_8_ = local_2b0 + 0x10;
  local_2c0 = mesh;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"$MeshFormat","");
  seek_line(stream,(string *)local_2b0);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0])
                    + 1);
  }
  piVar17 = std::istream::_M_extract<double>((double *)stream);
  piVar18 = (istream *)std::istream::operator>>((istream *)piVar17,(int *)&local_84);
  std::istream::operator>>(piVar18,(int *)((long)&uStack_1c0 + 4));
  if (1 < local_84) {
    pcVar32 = "file_type == 0 || file_type == 1";
    uVar22 = 0xdd;
LAB_002d4ca3:
    fail("assertion %s failed at %s +%d\n",pcVar32,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
         ,uVar22);
  }
  if (local_84 == 1) {
    eat_newlines(stream);
    binary::read_value<int>(stream,(int *)local_2b0,false);
    bVar43 = local_2b0._0_4_ != 1;
    if (bVar43) {
      binary::swap_bytes<int>((int *)local_2b0);
      if (local_2b0._0_4_ != 1) {
        pcVar32 = "one == 1";
        uVar22 = 0xe7;
        goto LAB_002d4ca3;
      }
    }
  }
  else {
    bVar43 = false;
  }
  if (uStack_1c0._4_4_ != 8) {
    pcVar32 = "data_size == sizeof(Real)";
    uVar22 = 0xea;
    goto LAB_002d4ca3;
  }
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"$PhysicalNames","");
  bVar13 = seek_optional_section(stream,(string *)local_2b0);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0])
                    + 1);
  }
  local_350 = (ClassSets *)CONCAT44(local_350._4_4_,local_84);
  uVar15 = local_84;
  local_358 = stream;
  if (bVar13) {
    if (local_84 == 1) {
      binary::read_value<int>(stream,(int *)&local_1b8,bVar43);
    }
    else {
      std::istream::operator>>((istream *)stream,(int *)&local_1b8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_138,
              (long)(int)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
    eat_newlines(stream);
    if (0 < (int)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start) {
      iVar31 = 0;
      do {
        if ((uint)local_350 == 1) {
          binary::read_value<int>(local_358,(int *)&local_b8,bVar43);
        }
        else {
          std::istream::operator>>((istream *)local_358,(int *)&local_b8);
        }
        if ((uint)local_350 == 1) {
          binary::read_value<int>(local_358,(int *)local_2e8,bVar43);
        }
        else {
          std::istream::operator>>((istream *)local_358,(int *)local_2e8);
        }
        iVar31 = iVar31 + 1;
        if (iVar31 != local_2e8._0_4_) {
          fail("assertion %s failed at %s +%d\n","number == i + 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
               ,0xf5);
        }
        local_2b0._0_8_ = local_2b0 + 0x10;
        local_2b0._8_8_ = (pointer)0x0;
        local_2a0[0]._M_local_buf[0] = '\0';
        std::operator>>(local_358,(string *)local_2b0);
        std::__cxx11::string::substr((ulong)&local_118,(ulong)local_2b0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
                   &local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
          operator_delete((void *)local_2b0._0_8_,
                          CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,
                                   local_2a0[0]._M_local_buf[0]) + 1);
        }
      } while (iVar31 < (int)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
    }
    uVar15 = (uint)local_350;
  }
  piVar17 = local_358;
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"$Entities","");
  bVar13 = seek_optional_section(piVar17,(string *)local_2b0);
  if ((vector<int,std::allocator<int>> *)local_2b0._0_8_ !=
      (vector<int,std::allocator<int>> *)(local_2b0 + 0x10)) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0])
                    + 1);
  }
  if (bVar13) {
    local_310 = (pointer)local_2b8;
    if (uVar15 == 1) {
      binary::read_value<int>(piVar17,(int *)&local_b8,bVar43);
      binary::read_value<int>(piVar17,(int *)local_2e8,bVar43);
      binary::read_value<int>(piVar17,(int *)&local_308,bVar43);
      binary::read_value<int>(piVar17,(int *)&local_320,bVar43);
    }
    else {
      std::istream::operator>>((istream *)piVar17,(int *)&local_b8);
      std::istream::operator>>((istream *)piVar17,(int *)local_2e8);
      std::istream::operator>>((istream *)piVar17,(int *)&local_308);
      std::istream::operator>>((istream *)piVar17,(int *)&local_320);
    }
    iVar31 = local_b8._M_impl._0_4_ + -1;
    bVar13 = 0 < (int)local_b8._M_impl._0_4_;
    local_b8._M_impl._0_4_ = iVar31;
    if (bVar13) {
      pCVar1 = &local_2c0->class_sets;
      do {
        if ((uint)local_350 == 1) {
          binary::read_value<int>(piVar17,(int *)&local_118,bVar43);
        }
        else {
          std::istream::operator>>((istream *)piVar17,(int *)&local_118);
        }
        if ((uint)local_350 == 1) {
          binary::read_value<double>(piVar17,(double *)local_2b0,bVar43);
        }
        else {
          std::istream::_M_extract<double>((double *)piVar17);
        }
        if ((uint)local_350 == 1) {
          binary::read_value<double>(piVar17,(double *)(local_2b0 + 8),bVar43);
        }
        else {
          std::istream::_M_extract<double>((double *)piVar17);
        }
        if ((uint)local_350 == 1) {
          binary::read_value<double>(piVar17,(double *)(local_2b0 + 0x10),bVar43);
        }
        else {
          std::istream::_M_extract<double>((double *)piVar17);
        }
        if (((double)local_310 == 4.0) && (!NAN((double)local_310))) {
          if ((uint)local_350 == 1) {
            binary::read_value<double>(piVar17,(double *)local_2b0,bVar43);
          }
          else {
            std::istream::_M_extract<double>((double *)piVar17);
          }
          if ((uint)local_350 == 1) {
            binary::read_value<double>(piVar17,(double *)(local_2b0 + 8),bVar43);
          }
          else {
            std::istream::_M_extract<double>((double *)piVar17);
          }
          if ((uint)local_350 == 1) {
            binary::read_value<double>(piVar17,(double *)(local_2b0 + 0x10),bVar43);
          }
          else {
            std::istream::_M_extract<double>((double *)piVar17);
          }
        }
        if ((uint)local_350 == 1) {
          binary::read_value<int>(piVar17,(int *)&local_1b8,bVar43);
        }
        else {
          std::istream::operator>>((istream *)piVar17,(int *)&local_1b8);
        }
        while( true ) {
          iVar31 = (int)local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
          local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_1b8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_1b8.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start + -1);
          if (iVar31 < 1) break;
          if ((uint)local_350 == 1) {
            binary::read_value<int>(piVar17,(int *)&local_330,bVar43);
          }
          else {
            std::istream::operator>>((istream *)piVar17,(int *)&local_330);
          }
          if ((ulong)(uint)local_330.write_.shared_alloc_.alloc == 0) {
            fail("assertion %s failed at %s +%d\n","physical != 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
                 ,0xac);
          }
          if (0 < (int)(uint)local_330.write_.shared_alloc_.alloc) {
            pvVar19 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                      ::operator[](pCVar1,local_138.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                          ((ulong)(uint)local_330.write_.shared_alloc_.alloc - 1));
            local_340 = 0;
            std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
            emplace_back<int,int&>(pvVar19,&local_340,(int *)&local_118);
          }
        }
        iVar31 = local_b8._M_impl._0_4_ + -1;
        bVar13 = 0 < (int)local_b8._M_impl._0_4_;
        local_b8._M_impl._0_4_ = iVar31;
      } while (bVar13);
    }
    local_118._M_dataplus._M_p._4_4_ = 2;
    local_118._M_dataplus._M_p._0_4_ = (int)local_2e8._0_8_;
    local_118._M_string_length =
         CONCAT44(2,local_308.
                    super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                    _M_impl.super__Vector_impl_data._M_start._0_4_);
    local_118.field_2._M_allocated_capacity._4_4_ = 3;
    local_118.field_2._M_allocated_capacity._0_4_ = (uint)local_320.write_.shared_alloc_.alloc;
    __l._M_len = 3;
    __l._M_array = (iterator)&local_118;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_2b0,__l,
               (allocator_type *)&local_1b8);
    local_310 = (pointer)local_2b0._8_8_;
    if (local_2b0._0_8_ != local_2b0._8_8_) {
      pCVar1 = &local_2c0->class_sets;
      ppVar39 = (pointer)local_2b0._0_8_;
      do {
        local_330.write_.shared_alloc_.alloc._0_4_ = ppVar39->second;
        iVar31 = ppVar39->first;
        if (0 < ppVar39->first) {
          do {
            if ((uint)local_350 == 1) {
              binary::read_value<int>(piVar17,&local_340,bVar43);
            }
            else {
              std::istream::operator>>((istream *)piVar17,&local_340);
            }
            if ((uint)local_350 == 1) {
              binary::read_value<double>(piVar17,(double *)&local_118,bVar43);
            }
            else {
              std::istream::_M_extract<double>((double *)piVar17);
            }
            if ((uint)local_350 == 1) {
              binary::read_value<double>(piVar17,(double *)&local_118._M_string_length,bVar43);
            }
            else {
              std::istream::_M_extract<double>((double *)piVar17);
            }
            if ((uint)local_350 == 1) {
              binary::read_value<double>
                        (piVar17,(double *)&local_118.field_2._M_allocated_capacity,bVar43);
            }
            else {
              std::istream::_M_extract<double>((double *)piVar17);
            }
            if ((uint)local_350 == 1) {
              binary::read_value<double>(piVar17,(double *)&local_1b8,bVar43);
            }
            else {
              std::istream::_M_extract<double>((double *)piVar17);
            }
            if ((uint)local_350 == 1) {
              binary::read_value<double>
                        (piVar17,(double *)
                                 &local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish,bVar43);
            }
            else {
              std::istream::_M_extract<double>((double *)piVar17);
            }
            if ((uint)local_350 == 1) {
              binary::read_value<double>
                        (piVar17,(double *)
                                 &local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,bVar43);
            }
            else {
              std::istream::_M_extract<double>((double *)piVar17);
            }
            if ((uint)local_350 == 1) {
              binary::read_value<int>(piVar17,(int *)&local_35c,bVar43);
            }
            else {
              std::istream::operator>>((istream *)piVar17,(int *)&local_35c);
            }
            while( true ) {
              uVar15 = local_35c - 1;
              if ((int)local_35c < 1) break;
              if ((uint)local_350 == 1) {
                local_35c = uVar15;
                binary::read_value<int>(piVar17,(int *)&local_344,bVar43);
              }
              else {
                local_35c = uVar15;
                std::istream::operator>>((istream *)piVar17,(int *)&local_344);
              }
              if ((ulong)local_344 == 0) {
                fail("assertion %s failed at %s +%d\n","physical != 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
                     ,199);
              }
              if (0 < (int)local_344) {
                pvVar19 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
                          std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                          ::operator[](pCVar1,local_138.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                              ((ulong)local_344 - 1));
                std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
                emplace_back<int_const&,int&>(pvVar19,(int *)&local_330,&local_340);
              }
            }
            if ((uint)local_350 == 1) {
              local_35c = uVar15;
              binary::read_value<int>(piVar17,(int *)&local_344,bVar43);
            }
            else {
              local_35c = uVar15;
              std::istream::operator>>((istream *)piVar17,(int *)&local_344);
            }
            while (uVar15 = local_344 - 1, 0 < (int)local_344) {
              if ((uint)local_350 == 1) {
                local_344 = uVar15;
                binary::read_value<int>(piVar17,&local_338,bVar43);
              }
              else {
                local_344 = uVar15;
                std::istream::operator>>((istream *)piVar17,&local_338);
              }
            }
            bVar13 = 1 < iVar31;
            iVar31 = iVar31 + -1;
            local_344 = uVar15;
          } while (bVar13);
        }
        ppVar39 = ppVar39 + 1;
      } while (ppVar39 != local_310);
    }
    if ((vector<int,std::allocator<int>> *)local_2b0._0_8_ != (vector<int,std::allocator<int>> *)0x0
       ) {
      operator_delete((void *)local_2b0._0_8_,
                      CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0]
                              ) - local_2b0._0_8_);
    }
    local_2b0._0_8_ = local_2b0 + 0x10;
    local_2b0._8_8_ = (pointer)0x0;
    local_2a0[0]._M_local_buf[0] = '\0';
    cVar14 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar17 + -0x18) + (char)piVar17);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (piVar17,(string *)local_2b0,cVar14);
    if ((pointer)local_2b0._8_8_ != (pointer)0x0) {
      pbVar2 = (byte *)(local_2b0._0_8_ + local_2b0._8_8_);
      pbVar42 = (byte *)local_2b0._0_8_;
      if (0 < (long)local_2b0._8_8_ >> 2) {
        pbVar42 = (byte *)(local_2b0._0_8_ + (local_2b0._8_8_ & 0xfffffffffffffffc));
        lVar37 = ((long)local_2b0._8_8_ >> 2) + 1;
        pbVar40 = (byte *)(local_2b0._0_8_ + 3);
        do {
          iVar31 = isspace((uint)pbVar40[-3]);
          if (iVar31 != 0) {
            pbVar40 = pbVar40 + -3;
            goto LAB_002d3196;
          }
          iVar31 = isspace((uint)pbVar40[-2]);
          if (iVar31 != 0) {
            pbVar40 = pbVar40 + -2;
            goto LAB_002d3196;
          }
          iVar31 = isspace((uint)pbVar40[-1]);
          if (iVar31 != 0) {
            pbVar40 = pbVar40 + -1;
            goto LAB_002d3196;
          }
          iVar31 = isspace((uint)*pbVar40);
          if (iVar31 != 0) goto LAB_002d3196;
          lVar37 = lVar37 + -1;
          pbVar40 = pbVar40 + 4;
        } while (1 < lVar37);
      }
      lVar37 = (long)pbVar2 - (long)pbVar42;
      if (lVar37 == 1) {
LAB_002d3173:
        iVar31 = isspace((uint)*pbVar42);
        pbVar40 = pbVar42;
        if (iVar31 == 0) {
          pbVar40 = pbVar2;
        }
      }
      else if (lVar37 == 2) {
LAB_002d3163:
        iVar31 = isspace((uint)*pbVar42);
        pbVar40 = pbVar42;
        if (iVar31 == 0) {
          pbVar42 = pbVar42 + 1;
          goto LAB_002d3173;
        }
      }
      else {
        pbVar40 = pbVar2;
        if ((lVar37 == 3) && (iVar31 = isspace((uint)*pbVar42), pbVar40 = pbVar42, iVar31 == 0)) {
          pbVar42 = pbVar42 + 1;
          goto LAB_002d3163;
        }
      }
LAB_002d3196:
      pbVar42 = pbVar40 + 1;
      if (pbVar42 != pbVar2 && pbVar40 != pbVar2) {
        do {
          bVar4 = *pbVar42;
          iVar31 = isspace((uint)bVar4);
          if (iVar31 == 0) {
            *pbVar40 = bVar4;
            pbVar40 = pbVar40 + 1;
          }
          pbVar42 = pbVar42 + 1;
        } while (pbVar42 != pbVar2);
      }
      std::__cxx11::string::_M_erase((ulong)local_2b0,(long)pbVar40 - local_2b0._0_8_);
    }
    piVar17 = local_358;
    if ((pointer)local_2b0._8_8_ != (pointer)0x0) {
      uVar22 = 0x105;
      pcVar32 = "line.empty()";
LAB_002d4d48:
      fail("assertion %s failed at %s +%d\n",pcVar32,
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
           ,uVar22);
    }
    cVar14 = std::ios::widen((char)*(undefined8 *)(*(long *)local_358 + -0x18) + (char)local_358);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (piVar17,(string *)local_2b0,cVar14);
    iVar31 = std::__cxx11::string::compare(local_2b0);
    uVar15 = (uint)local_350;
    if (iVar31 != 0) {
      uVar22 = 0x107;
      pcVar32 = "line == \"$EndEntities\"";
      goto LAB_002d4d48;
    }
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_,
                      CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0]
                              ) + 1);
    }
  }
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"$Nodes","");
  seek_line(piVar17,(string *)local_2b0);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0])
                    + 1);
  }
  local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Vector<3> *)0x0;
  local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (Vector<3> *)0x0;
  p_Var3 = &local_b8._M_impl.super__Rb_tree_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  if (4.0 <= local_2b8) {
    eat_newlines(piVar17);
    if (uVar15 == 1) {
      binary::read_value<int>(piVar17,(int *)&local_118,bVar43);
      binary::read_value<int>(piVar17,&local_340,bVar43);
    }
    else {
      std::istream::operator>>((istream *)piVar17,(int *)&local_118);
      std::istream::operator>>((istream *)piVar17,&local_340);
    }
    std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::reserve
              (&local_308,(long)local_340);
    if (4.1 <= local_2b8) {
      if (uVar15 == 1) {
        binary::read_value<int>(piVar17,(int *)&local_1b8,bVar43);
        binary::read_value<int>(piVar17,(int *)&local_1b8,bVar43);
      }
      else {
        std::istream::operator>>((istream *)piVar17,(int *)&local_1b8);
        std::istream::operator>>((istream *)piVar17,(int *)&local_1b8);
      }
      if (0 < (int)local_118._M_dataplus._M_p) {
        iVar31 = 0;
        do {
          if ((uint)local_350 == 1) {
            binary::read_value<int>(piVar17,(int *)&local_320,bVar43);
          }
          else {
            std::istream::operator>>((istream *)piVar17,(int *)&local_320);
          }
          if ((uint)local_350 == 1) {
            binary::read_value<int>(piVar17,(int *)local_2e8,bVar43);
          }
          else {
            std::istream::operator>>((istream *)piVar17,(int *)local_2e8);
          }
          local_310 = (pointer)CONCAT44(local_310._4_4_,iVar31);
          if ((uint)local_350 == 1) {
            binary::read_value<int>(piVar17,(int *)&local_330,bVar43);
          }
          else {
            std::istream::operator>>((istream *)piVar17,(int *)&local_330);
          }
          if ((uint)local_350 == 1) {
            binary::read_value<int>(piVar17,(int *)&local_35c,bVar43);
          }
          else {
            std::istream::operator>>((istream *)piVar17,(int *)&local_35c);
          }
          if (0 < (int)local_35c) {
            iVar31 = 0;
            do {
              if ((uint)local_350 == 1) {
                binary::read_value<int>(piVar17,(int *)local_2b0,bVar43);
              }
              else {
                std::istream::operator>>((istream *)piVar17,(int *)local_2b0);
              }
              pVVar11 = local_308.
                        super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pVVar25 = local_308.
                        super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pmVar20 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&local_b8,(key_type *)local_2b0);
              *pmVar20 = (int)((ulong)((long)pVVar11 - (long)pVVar25) >> 3) * -0x55555555 + iVar31;
              iVar31 = iVar31 + 1;
              piVar17 = local_358;
            } while (iVar31 < (int)local_35c);
          }
          if (0 < (int)local_35c) {
            iVar31 = 0;
            do {
              if ((uint)local_350 == 1) {
                binary::read_value<double>(piVar17,(double *)local_2b0,bVar43);
              }
              else {
                std::istream::_M_extract<double>((double *)piVar17);
              }
              if ((uint)local_350 == 1) {
                binary::read_value<double>(piVar17,(double *)(local_2b0 + 8),bVar43);
              }
              else {
                std::istream::_M_extract<double>((double *)piVar17);
              }
              if ((uint)local_350 == 1) {
                binary::read_value<double>(piVar17,(double *)(local_2b0 + 0x10),bVar43);
              }
              else {
                std::istream::_M_extract<double>((double *)piVar17);
              }
              if (local_308.
                  super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_308.
                  super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<Omega_h::Vector<3>,std::allocator<Omega_h::Vector<3>>>::
                _M_realloc_insert<Omega_h::Vector<3>const&>
                          ((vector<Omega_h::Vector<3>,std::allocator<Omega_h::Vector<3>>> *)
                           &local_308,
                           (iterator)
                           local_308.
                           super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(Vector<3> *)local_2b0);
              }
              else {
                ((local_308.
                  super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[2] =
                     (double)CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,
                                      local_2a0[0]._M_local_buf[0]);
                ((local_308.
                  super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[0] =
                     (double)local_2b0._0_8_;
                ((local_308.
                  super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[1] =
                     (double)local_2b0._8_8_;
                local_308.
                super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl
                .super__Vector_impl_data._M_finish =
                     local_308.
                     super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              iVar31 = iVar31 + 1;
            } while (iVar31 < (int)local_35c);
          }
          iVar31 = (int)local_310 + 1;
        } while (iVar31 < (int)local_118._M_dataplus._M_p);
      }
    }
    else if (0 < (int)local_118._M_dataplus._M_p) {
      local_310 = (pointer)((ulong)local_310 & 0xffffffff00000000);
      do {
        if (uVar15 == 1) {
          binary::read_value<int>(piVar17,(int *)&local_1b8,bVar43);
          binary::read_value<int>(piVar17,(int *)local_2e8,bVar43);
          binary::read_value<int>(piVar17,(int *)&local_320,bVar43);
          binary::read_value<int>(piVar17,(int *)&local_330,bVar43);
        }
        else {
          std::istream::operator>>((istream *)piVar17,(int *)&local_1b8);
          std::istream::operator>>((istream *)piVar17,(int *)local_2e8);
          std::istream::operator>>((istream *)piVar17,(int *)&local_320);
          std::istream::operator>>((istream *)piVar17,(int *)&local_330);
        }
        if (0 < (int)(uint)local_330.write_.shared_alloc_.alloc) {
          iVar31 = 0;
          do {
            if (uVar15 == 1) {
              binary::read_value<int>(local_358,(int *)&local_35c,bVar43);
            }
            else {
              std::istream::operator>>((istream *)local_358,(int *)&local_35c);
            }
            pVVar11 = local_308.
                      super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            pVVar25 = local_308.
                      super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pmVar20 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_b8,(key_type *)&local_35c);
            *pmVar20 = (int)((ulong)((long)pVVar11 - (long)pVVar25) >> 3) * -0x55555555;
            uVar15 = (uint)local_350;
            if ((uint)local_350 == 1) {
              binary::read_value<double>(local_358,(double *)local_2b0,bVar43);
              binary::read_value<double>(local_358,(double *)(local_2b0 + 8),bVar43);
              binary::read_value<double>(local_358,(double *)(local_2b0 + 0x10),bVar43);
            }
            else {
              std::istream::_M_extract<double>((double *)local_358);
              std::istream::_M_extract<double>((double *)local_358);
              std::istream::_M_extract<double>((double *)local_358);
            }
            if (local_308.
                super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_308.
                super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<Omega_h::Vector<3>,std::allocator<Omega_h::Vector<3>>>::
              _M_realloc_insert<Omega_h::Vector<3>const&>
                        ((vector<Omega_h::Vector<3>,std::allocator<Omega_h::Vector<3>>> *)&local_308
                         ,(iterator)
                          local_308.
                          super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,(Vector<3> *)local_2b0);
            }
            else {
              ((local_308.
                super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl
                .super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[2] =
                   (double)CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,
                                    local_2a0[0]._M_local_buf[0]);
              ((local_308.
                super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl
                .super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[0] =
                   (double)local_2b0._0_8_;
              ((local_308.
                super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl
                .super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[1] =
                   (double)local_2b0._8_8_;
              local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_308.
                   super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            iVar31 = iVar31 + 1;
          } while (iVar31 < (int)(uint)local_330.write_.shared_alloc_.alloc);
        }
        iVar31 = (int)local_310 + 1;
        local_310 = (pointer)CONCAT44(local_310._4_4_,iVar31);
        piVar17 = local_358;
      } while (iVar31 < (int)local_118._M_dataplus._M_p);
    }
  }
  else {
    std::istream::operator>>((istream *)piVar17,&local_340);
    if ((long)local_340 < 0) {
      fail("assertion %s failed at %s +%d\n","nnodes >= 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
           ,0x145);
    }
    std::vector<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>::reserve
              (&local_308,(long)local_340);
    eat_newlines(piVar17);
    if (0 < local_340) {
      iVar31 = 0;
      do {
        if ((uint)local_350 == 1) {
          binary::read_value<int>(local_358,(int *)&local_118,bVar43);
        }
        else {
          std::istream::operator>>((istream *)local_358,(int *)&local_118);
        }
        iVar31 = iVar31 + 1;
        if (iVar31 != (int)local_118._M_dataplus._M_p) {
          fail("assertion %s failed at %s +%d\n","number == i + 1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
               ,0x14e);
        }
        if ((uint)local_350 == 1) {
          binary::read_value<double>(local_358,(double *)local_2b0,bVar43);
        }
        else {
          std::istream::_M_extract<double>((double *)local_358);
        }
        if ((uint)local_350 == 1) {
          binary::read_value<double>(local_358,(double *)(local_2b0 + 8),bVar43);
        }
        else {
          std::istream::_M_extract<double>((double *)local_358);
        }
        if ((uint)local_350 == 1) {
          binary::read_value<double>(local_358,(double *)(local_2b0 + 0x10),bVar43);
        }
        else {
          std::istream::_M_extract<double>((double *)local_358);
        }
        if (local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Omega_h::Vector<3>,std::allocator<Omega_h::Vector<3>>>::
          _M_realloc_insert<Omega_h::Vector<3>const&>
                    ((vector<Omega_h::Vector<3>,std::allocator<Omega_h::Vector<3>>> *)&local_308,
                     (iterator)
                     local_308.
                     super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(Vector<3> *)local_2b0);
        }
        else {
          ((local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
            _M_impl.super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[2] =
               (double)CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,
                                local_2a0[0]._M_local_buf[0]);
          ((local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
            _M_impl.super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[0] =
               (double)local_2b0._0_8_;
          ((local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
            _M_impl.super__Vector_impl_data._M_finish)->super_Few<double,_3>).array_[1] =
               (double)local_2b0._8_8_;
          local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_308.
               super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      } while (iVar31 < local_340);
    }
  }
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"$Elements","");
  piVar17 = local_358;
  seek_line(local_358,(string *)local_2b0);
  iVar31 = (uint)local_350;
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0])
                    + 1);
  }
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_118.field_2._M_allocated_capacity = 0;
  local_118.field_2._8_8_ = 0;
  local_118._M_dataplus._M_p = (pointer)0x0;
  local_118._M_string_length = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  lStack_170 = 0;
  local_188 = 0;
  lStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lStack_1a0 = 0;
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  if (4.0 <= local_2b8) {
    eat_newlines(piVar17);
    if (iVar31 == 1) {
      binary::read_value<int>(piVar17,(int *)local_2b0,bVar43);
      binary::read_value<int>(piVar17,(int *)local_2e8,bVar43);
    }
    else {
      std::istream::operator>>((istream *)piVar17,(int *)local_2b0);
      std::istream::operator>>((istream *)piVar17,(int *)local_2e8);
    }
    if (4.1 <= local_2b8) {
      if (iVar31 == 1) {
        binary::read_value<int>(piVar17,(int *)&local_320,bVar43);
        binary::read_value<int>(piVar17,(int *)&local_320,bVar43);
      }
      else {
        std::istream::operator>>((istream *)piVar17,(int *)&local_320);
        std::istream::operator>>((istream *)piVar17,(int *)&local_320);
      }
    }
    if ((int)local_2b0._0_4_ < 1) {
      local_33c = OMEGA_H_SIMPLEX;
    }
    else {
      local_33c = OMEGA_H_SIMPLEX;
      local_1d0 = "dim == class_dim";
      iVar30 = 0;
      do {
        if ((local_2b8 != 4.0) || (NAN(local_2b8))) {
          if (iVar31 == 1) {
            binary::read_value<int>(piVar17,(int *)&local_330,bVar43);
          }
          else {
            std::istream::operator>>((istream *)piVar17,(int *)&local_330);
          }
          val = &local_320;
        }
        else {
          if (iVar31 == 1) {
            binary::read_value<int>(piVar17,(int *)&local_320,bVar43);
          }
          else {
            std::istream::operator>>((istream *)piVar17,(int *)&local_320);
          }
          val = &local_330;
        }
        if (iVar31 == 1) {
          binary::read_value<int>(piVar17,(int *)val,bVar43);
          binary::read_value<int>(piVar17,(int *)&local_35c,bVar43);
          binary::read_value<int>(piVar17,(int *)&local_344,bVar43);
        }
        else {
          std::istream::operator>>((istream *)piVar17,(int *)val);
          std::istream::operator>>((istream *)piVar17,(int *)&local_35c);
          std::istream::operator>>((istream *)piVar17,(int *)&local_344);
        }
        uVar15 = type_dim(local_35c);
        if (uVar15 != (uint)local_330.write_.shared_alloc_.alloc) {
          uVar22 = 0x172;
          goto LAB_002d4bd9;
        }
        uVar22 = 0x40;
        if (0xf < local_35c) {
LAB_002d4c59:
          local_1d0 = "false";
LAB_002d4bd9:
          fail("assertion %s failed at %s +%d\n",local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
               ,uVar22);
        }
        if ((0x8016U >> (local_35c & 0x1f) & 1) == 0) {
          if ((0x28U >> (local_35c & 0x1f) & 1) == 0) goto LAB_002d4c59;
          local_33c = OMEGA_H_HYPERCUBE;
        }
        uVar24 = (ulong)uVar15;
        local_1c8 = (_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                     *)CONCAT44(local_1c8._4_4_,iVar30);
        if (local_33c == OMEGA_H_SIMPLEX) {
          iVar31 = uVar15 + 1;
        }
        else {
          iVar31 = *(int *)(&DAT_0044eba8 + uVar24 * 4);
        }
        local_310 = (pointer)(&local_118._M_dataplus + uVar24 * 3);
        std::vector<int,_std::allocator<int>_>::reserve
                  ((vector<int,_std::allocator<int>_> *)local_310,
                   (long)(int)local_344 +
                   ((long)((&local_118._M_string_length)[uVar24 * 3] - (long)*local_310) >> 2));
        this_00 = (vector<int,std::allocator<int>> *)(&local_1b8 + uVar24);
        std::vector<int,_std::allocator<int>_>::reserve
                  ((vector<int,_std::allocator<int>_> *)this_00,
                   (long)iVar31 * (long)(int)local_344 +
                   ((long)(&local_1b8)[uVar24].super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_finish - *(long *)this_00 >> 2));
        if (0 < (int)local_344) {
          iVar30 = 0;
          do {
            pVar5 = local_310[1];
            if (pVar5 == local_310[2]) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)local_310,(iterator)pVar5,
                         (int *)&local_320);
            }
            else {
              *(uint *)pVar5 = (uint)local_320.write_.shared_alloc_.alloc;
              local_310[1] = (pair<int,_int>)((long)pVar5 + 4);
            }
            if ((uint)local_350 == 1) {
              binary::read_value<int>(local_358,&local_338,bVar43);
            }
            else {
              std::istream::operator>>((istream *)local_358,&local_338);
            }
            iVar38 = 0;
            do {
              p_Var21 = &p_Var3->_M_header;
              if ((uint)local_350 == 1) {
                binary::read_value<int>(local_358,&local_334,bVar43);
                p_Var10 = local_b8._M_impl.super__Rb_tree_header._M_header._M_parent;
              }
              else {
                std::istream::operator>>((istream *)local_358,&local_334);
                p_Var10 = local_b8._M_impl.super__Rb_tree_header._M_header._M_parent;
              }
              for (; (_Rb_tree_header *)p_Var10 != (_Rb_tree_header *)0x0;
                  p_Var10 = (&p_Var10->_M_left)[(int)*(size_t *)(p_Var10 + 1) < local_334]) {
                if (local_334 <= (int)*(size_t *)(p_Var10 + 1)) {
                  p_Var21 = p_Var10;
                }
              }
              p_Var28 = p_Var3;
              if (((_Rb_tree_header *)p_Var21 != p_Var3) &&
                 (p_Var28 = (_Rb_tree_header *)p_Var21,
                 local_334 < (int)((_Rb_tree_header *)p_Var21)->_M_node_count)) {
                p_Var28 = p_Var3;
              }
              if (p_Var28 == p_Var3) {
                fail("assertion %s failed at %s +%d\n","it != node_number_map.end()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
                     ,0x183);
              }
              piVar29 = (int *)((long)&p_Var28->_M_node_count + 4);
              iVar6._M_current =
                   (&local_1b8)[uVar24].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (&local_1b8)[uVar24].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (this_00,iVar6,piVar29);
              }
              else {
                *iVar6._M_current = *piVar29;
                (&local_1b8)[uVar24].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar6._M_current + 1;
              }
              iVar38 = iVar38 + 1;
            } while (iVar38 != iVar31);
            iVar30 = iVar30 + 1;
          } while (iVar30 < (int)local_344);
        }
        iVar30 = (int)local_1c8 + 1;
        piVar17 = local_358;
        iVar31 = (uint)local_350;
      } while (iVar30 < (int)local_2b0._0_4_);
    }
    goto LAB_002d43f8;
  }
  std::istream::operator>>((istream *)piVar17,(int *)&local_320);
  if ((int)(uint)local_320.write_.shared_alloc_.alloc < 0) {
    fail("assertion %s failed at %s +%d\n","nents >= 0",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
         ,0x18c);
  }
  lVar37 = 0xe0;
  puVar23 = auStack_280;
  do {
    puVar23[-6] = puVar23;
    puVar23[-5] = 1;
    puVar23[-4] = 0;
    puVar23[-3] = 0;
    *(undefined4 *)(puVar23 + -2) = 0x3f800000;
    puVar23[-1] = 0;
    *puVar23 = 0;
    puVar23 = puVar23 + 7;
    lVar37 = lVar37 + -0x38;
  } while (lVar37 != 0);
  if (iVar31 == 1) {
    eat_newlines(piVar17);
    if ((int)(uint)local_320.write_.shared_alloc_.alloc < 1) {
LAB_002d3f0d:
      local_33c = OMEGA_H_SIMPLEX;
    }
    else {
      local_33c = OMEGA_H_SIMPLEX;
      iVar31 = 0;
      do {
        piVar17 = local_358;
        binary::read_value<int>(local_358,(int *)local_2e8,bVar43);
        binary::read_value<int>(piVar17,(int *)&local_330,bVar43);
        binary::read_value<int>(piVar17,(int *)&local_35c,bVar43);
        uVar15 = type_dim(local_2e8._0_4_);
        if (0xf < (uint)local_2e8._0_4_) {
LAB_002d4ccb:
          fail("assertion %s failed at %s +%d\n","false",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
               ,0x40);
        }
        if ((0x8016U >> (local_2e8._0_4_ & 0x1f) & 1) == 0) {
          if ((0x28U >> (local_2e8._0_4_ & 0x1f) & 1) == 0) goto LAB_002d4ccb;
          local_33c = OMEGA_H_HYPERCUBE;
        }
        if (local_33c == OMEGA_H_SIMPLEX) {
          iVar30 = uVar15 + 1;
        }
        else {
          iVar30 = *(int *)(&DAT_0044eba8 + (ulong)uVar15 * 4);
        }
        local_350 = (ClassSets *)CONCAT44(local_350._4_4_,iVar30);
        if ((int)local_35c < 2) {
          fail("assertion %s failed at %s +%d\n","ntags >= 2",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
               ,0x19b);
        }
        if (0 < (int)(uint)local_330.write_.shared_alloc_.alloc) {
          lVar37 = (ulong)(uVar15 << 3) * 3;
          local_310 = (pointer)((long)&local_118._M_dataplus._M_p + lVar37);
          local_1c8 = (_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                       *)(local_2b0 + (ulong)uVar15 * 0x38);
          iVar30 = 0;
          do {
            ppVar39 = local_310;
            binary::read_value<int>(local_358,(int *)&local_344,bVar43);
            binary::read_value<int>(local_358,&local_338,bVar43);
            binary::read_value<int>(local_358,&local_334,bVar43);
            pVar5 = ppVar39[1];
            if (pVar5 == ppVar39[2]) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)ppVar39,(iterator)pVar5,&local_334);
            }
            else {
              *(int *)pVar5 = local_334;
              ppVar39[1] = (pair<int,_int>)((long)pVar5 + 4);
            }
            if (local_338 != 0) {
              std::
              _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<int&,int&>(local_1c8,&local_334,&local_338);
            }
            iVar38 = (uint)local_350;
            if (2 < (int)local_35c) {
              iVar38 = 2;
              do {
                binary::read_value<int>(local_358,&local_2c4,false);
                iVar38 = iVar38 + 1;
              } while (iVar38 < (int)local_35c);
              iVar38 = (uint)local_350;
            }
            do {
              binary::read_value<int>(local_358,&local_2c4,bVar43);
              local_2c8 = local_2c4 + -1;
              iVar6._M_current =
                   *(int **)((long)&local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish + lVar37);
              if (iVar6._M_current ==
                  *(int **)((long)&local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar37)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar37),iVar6,&local_2c8);
              }
              else {
                *iVar6._M_current = local_2c8;
                *(int **)((long)&local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish + lVar37) = iVar6._M_current + 1;
              }
              iVar38 = iVar38 + -1;
            } while (iVar38 != 0);
            iVar30 = iVar30 + 1;
            iVar31 = iVar31 + 1;
          } while (iVar30 < (int)(uint)local_330.write_.shared_alloc_.alloc);
        }
      } while (iVar31 < (int)(uint)local_320.write_.shared_alloc_.alloc);
    }
  }
  else {
    if ((int)(uint)local_320.write_.shared_alloc_.alloc < 1) goto LAB_002d3f0d;
    iVar31 = 0;
    local_33c = OMEGA_H_SIMPLEX;
    do {
      std::istream::operator>>((istream *)local_358,(int *)local_2e8);
      if ((int)local_2e8._0_4_ < 1) {
        fail("assertion %s failed at %s +%d\n","number > 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0x1b4);
      }
      std::istream::operator>>((istream *)local_358,(int *)&local_330);
      uVar15 = type_dim((uint)local_330.write_.shared_alloc_.alloc);
      if (0xf < (uint)local_330.write_.shared_alloc_.alloc) {
LAB_002d4caa:
        fail("assertion %s failed at %s +%d\n","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0x40);
      }
      if ((0x8016U >> ((uint)local_330.write_.shared_alloc_.alloc & 0x1f) & 1) == 0) {
        if ((0x28U >> ((uint)local_330.write_.shared_alloc_.alloc & 0x1f) & 1) == 0)
        goto LAB_002d4caa;
        local_33c = OMEGA_H_HYPERCUBE;
      }
      std::istream::operator>>((istream *)local_358,(int *)&local_35c);
      if ((int)local_35c < 2) {
        fail("assertion %s failed at %s +%d\n","ntags >= 2",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
             ,0x1bb);
      }
      piVar18 = (istream *)std::istream::operator>>((istream *)local_358,(int *)&local_344);
      std::istream::operator>>(piVar18,&local_338);
      uVar24 = (ulong)uVar15;
      iVar6._M_current = (int *)(&local_118._M_string_length)[uVar24 * 3];
      if (iVar6._M_current == *(int **)((long)&local_118.field_2 + uVar24 * 0x18)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)(&local_118._M_dataplus + uVar24 * 3),iVar6,
                   &local_338);
      }
      else {
        *iVar6._M_current = local_338;
        (&local_118._M_string_length)[uVar24 * 3] = (size_type)(iVar6._M_current + 1);
      }
      if (local_344 != 0) {
        std::
        _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<int&,int&>
                  ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)(local_2b0 + uVar24 * 0x38),&local_338,&local_344);
      }
      if (2 < (int)local_35c) {
        iVar30 = 2;
        do {
          std::istream::operator>>((istream *)local_358,&local_334);
          iVar30 = iVar30 + 1;
        } while (iVar30 < (int)local_35c);
      }
      iVar30 = uVar15 + 1;
      do {
        std::istream::operator>>((istream *)local_358,&local_2c4);
        local_2c8 = local_2c4 + -1;
        iVar6._M_current =
             (&local_1b8)[uVar24].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (&local_1b8)[uVar24].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_1b8 + uVar24,iVar6,&local_2c8);
        }
        else {
          *iVar6._M_current = local_2c8;
          (&local_1b8)[uVar24].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        iVar30 = iVar30 + -1;
      } while (iVar30 != 0);
      iVar31 = iVar31 + 1;
    } while (iVar31 < (int)(uint)local_320.write_.shared_alloc_.alloc);
  }
  local_330.write_.shared_alloc_.alloc._0_4_ = 0;
  local_350 = &local_2c0->class_sets;
  do {
    for (puVar23 = *(undefined8 **)
                    (local_2b0 + (long)(int)(uint)local_330.write_.shared_alloc_.alloc * 0x38 + 0x10
                    ); puVar23 != (undefined8 *)0x0; puVar23 = (undefined8 *)*puVar23) {
      local_35c = *(uint *)(puVar23 + 1);
      uVar15 = *(uint *)((long)puVar23 + 0xc);
      __val = -uVar15;
      if (0 < (int)uVar15) {
        __val = uVar15;
      }
      __len = 1;
      if (9 < __val) {
        uVar24 = (ulong)__val;
        uVar12 = 4;
        do {
          __len = uVar12;
          uVar16 = (uint)uVar24;
          if (uVar16 < 100) {
            __len = __len - 2;
            goto LAB_002d3fb3;
          }
          if (uVar16 < 1000) {
            __len = __len - 1;
            goto LAB_002d3fb3;
          }
          if (uVar16 < 10000) goto LAB_002d3fb3;
          uVar24 = uVar24 / 10000;
          uVar12 = __len + 4;
        } while (99999 < uVar16);
        __len = __len + 1;
      }
LAB_002d3fb3:
      local_2e8._0_8_ = local_2e8 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_2e8,(char)__len - (char)((int)uVar15 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_2e8._0_8_ + (ulong)(uVar15 >> 0x1f)),__len,__val);
      if ((int)uVar15 <=
          (int)((ulong)((long)local_138.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_138.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
        std::__cxx11::string::_M_assign((string *)local_2e8);
      }
      pvVar19 = (vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_>_>_>_>
                ::operator[](local_350,(key_type *)local_2e8);
      std::vector<Omega_h::ClassPair,std::allocator<Omega_h::ClassPair>>::
      emplace_back<int&,int_const&>(pvVar19,(int *)&local_330,(int *)&local_35c);
      if ((Alloc *)local_2e8._0_8_ != (Alloc *)(local_2e8 + 0x10)) {
        operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
      }
    }
    uVar15 = (uint)local_330.write_.shared_alloc_.alloc + 1;
    bVar43 = (int)(uint)local_330.write_.shared_alloc_.alloc < 3;
    local_330.write_.shared_alloc_.alloc._0_4_ = uVar15;
  } while (bVar43);
  lVar37 = 0xa8;
  do {
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(local_2b0 + lVar37));
    lVar37 = lVar37 + -0x38;
  } while (lVar37 != -0x38);
LAB_002d43f8:
  iVar31 = local_340;
  pVVar25 = (pointer)0x3;
  local_358 = (istream *)0x3;
  if (local_168 == lStack_170) {
    pVVar25 = (pointer)0x2;
    local_358 = (istream *)0x2;
    if (lStack_180 == local_188) {
      pVVar25 = (pointer)0x1;
      local_358 = (istream *)0x1;
      if (local_198 == lStack_1a0) {
        fail("There were no Elements of dimension higher than zero!\n");
      }
    }
  }
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"");
  HostWrite<double>::HostWrite
            ((HostWrite<double> *)local_2e8,iVar31 * (int)local_358,(string *)local_2b0);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0])
                    + 1);
  }
  uVar36 = (ulong)local_358 & 0xffffffff;
  uVar24 = uVar36;
  if (0 < (long)local_340) {
    lVar37 = 0;
    pVVar25 = local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar34 = 0;
      do {
        *(double *)(local_2e8._8_8_ + uVar34 * 8) = (pVVar25->super_Few<double,_3>).array_[uVar34];
        uVar34 = uVar34 + 1;
      } while (uVar36 != uVar34);
      lVar37 = lVar37 + 1;
      local_2e8._8_8_ = local_2e8._8_8_ + (ulong)(uint)((int)local_358 * 8);
      pVVar25 = pVVar25 + 1;
    } while (lVar37 != local_340);
  }
  do {
    if (local_33c == OMEGA_H_SIMPLEX) {
      bVar43 = true;
      __n = &switchD_002d4547::switchdataD_00454758;
      switch(uVar24 & 0xffffffff) {
      case 0:
        uVar15 = 1;
        break;
      case 1:
        uVar15 = 2;
        break;
      case 2:
        uVar15 = 3;
        break;
      case 3:
        uVar15 = 4;
        break;
      default:
        goto switchD_002d4526_default;
      }
    }
    else {
      __n = &switchD_002d4526::switchdataD_00454748;
      switch(uVar24 & 0xffffffff) {
      case 0:
        uVar15 = 1;
        break;
      case 1:
        uVar15 = 2;
        break;
      case 2:
        uVar15 = 4;
        break;
      case 3:
        uVar15 = 8;
        break;
      default:
switchD_002d4526_default:
        uVar15 = 0xffffffff;
        bVar43 = false;
        __n = (uint *)pVVar25;
        goto LAB_002d4570;
      }
      bVar43 = true;
    }
LAB_002d4570:
    uVar34 = (ulong)((long)(&local_1b8)[uVar24].super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(&local_1b8)[uVar24].super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start) >> 2;
    uVar34 = (long)((ulong)(uint)((int)uVar34 >> 0x1f) << 0x20 | uVar34 & 0xffffffff) /
             (long)(int)uVar15;
    local_2b0._0_8_ = local_2b0 + 0x10;
    local_350 = (ClassSets *)uVar24;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"");
    size_in = (LO)uVar34;
    HostWrite<int>::HostWrite(&local_320,size_in * uVar15,(string *)local_2b0);
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_,
                      CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0]
                              ) + 1);
    }
    local_2b0._0_8_ = local_2b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"");
    HostWrite<int>::HostWrite(&local_330,size_in,(string *)local_2b0);
    __buf = extraout_RDX;
    if ((Alloc *)local_2b0._0_8_ != (Alloc *)(local_2b0 + 0x10)) {
      operator_delete((void *)local_2b0._0_8_,
                      CONCAT71(local_2a0[0]._M_allocated_capacity._1_7_,local_2a0[0]._M_local_buf[0]
                              ) + 1);
      __buf = extraout_RDX_00;
    }
    if (0 < size_in) {
      __buf = (&local_118._M_dataplus)[uVar24 * 3]._M_p;
      uVar33 = 1;
      if (1 < (int)uVar15) {
        uVar33 = (ulong)uVar15;
      }
      lVar37 = 0;
      uVar35 = 0;
      __n = (uint *)local_320.write_.shared_alloc_.direct_ptr;
      do {
        if (bVar43) {
          piVar7 = (&local_1b8)[uVar24].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar41 = 0;
          do {
            *(uint *)((long)(((pointer)__n)->super_Few<double,_3>).array_ + uVar41 * 4) =
                 *(uint *)((long)piVar7 + uVar41 * 4 + lVar37);
            uVar41 = uVar41 + 1;
          } while (uVar33 != uVar41);
        }
        *(undefined4 *)((long)local_330.write_.shared_alloc_.direct_ptr + uVar35 * 4) =
             *(undefined4 *)(__buf + uVar35 * 4);
        uVar35 = uVar35 + 1;
        lVar37 = lVar37 + (long)(int)uVar15 * 4;
        __n = (uint *)((long)(((pointer)__n)->super_Few<double,_3>).array_ + (long)(int)uVar15 * 4);
      } while (uVar35 != (uVar34 & 0xffffffff));
    }
    HostWrite<int>::write((HostWrite<int> *)&local_40,(int)&local_320,__buf,(size_t)__n);
    Read<int>::Read((Read<signed_char> *)local_2b0,&local_40);
    pAVar9 = local_40.shared_alloc_.alloc;
    uVar27 = (undefined7)((ulong)__n >> 8);
    uVar22 = extraout_RDX_01;
    if (((ulong)local_40.shared_alloc_.alloc & 7) == 0 &&
        local_40.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar29 = &(local_40.shared_alloc_.alloc)->use_count;
      *piVar29 = *piVar29 + -1;
      if (*piVar29 == 0) {
        Alloc::~Alloc(local_40.shared_alloc_.alloc);
        operator_delete(pAVar9,0x48);
        uVar22 = extraout_RDX_02;
      }
    }
    if (local_350 == (ClassSets *)uVar36) {
      local_148.write_.shared_alloc_.alloc = (Alloc *)local_2b0._0_8_;
      bVar43 = (Alloc *)local_2b0._0_8_ == (Alloc *)0x0;
      puVar26 = (undefined1 *)CONCAT71(uVar27,bVar43);
      bVar13 = (local_2b0._0_8_ & 7) != 0;
      if (!bVar13 && !bVar43) {
        puVar26 = &entering_parallel;
        if (entering_parallel == '\x01') {
          local_148.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_2b0._0_8_ * 8 + 1);
        }
        else {
          *(int *)(local_2b0._0_8_ + 0x30) = *(int *)(local_2b0._0_8_ + 0x30) + 1;
        }
      }
      local_148.write_.shared_alloc_.direct_ptr = (void *)local_2b0._8_8_;
      HostWrite<double>::write
                ((HostWrite<double> *)&local_60,(int)local_2e8,
                 (void *)CONCAT71((int7)((ulong)uVar22 >> 8),bVar13 || bVar43),(size_t)puVar26);
      Read<double>::Read(&local_50,&local_60);
      ev2v = &local_148;
      build_from_elems_and_coords(local_2c0,local_33c,(Int)local_358,ev2v,(Reals *)&local_50);
      pAVar9 = local_50.write_.shared_alloc_.alloc;
      uVar27 = (undefined7)((ulong)ev2v >> 8);
      uVar22 = extraout_RDX_03;
      if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar29 = &(local_50.write_.shared_alloc_.alloc)->use_count;
        *piVar29 = *piVar29 + -1;
        if (*piVar29 == 0) {
          Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
          operator_delete(pAVar9,0x48);
          uVar22 = extraout_RDX_04;
        }
      }
      pAVar9 = local_60.shared_alloc_.alloc;
      if (((ulong)local_60.shared_alloc_.alloc & 7) == 0 &&
          local_60.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar29 = &(local_60.shared_alloc_.alloc)->use_count;
        *piVar29 = *piVar29 + -1;
        if (*piVar29 == 0) {
          Alloc::~Alloc(local_60.shared_alloc_.alloc);
          operator_delete(pAVar9,0x48);
          uVar22 = extraout_RDX_05;
        }
      }
      pAVar9 = local_148.write_.shared_alloc_.alloc;
      if (((ulong)local_148.write_.shared_alloc_.alloc & 7) == 0 &&
          local_148.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar29 = &(local_148.write_.shared_alloc_.alloc)->use_count;
        *piVar29 = *piVar29 + -1;
        if (*piVar29 == 0) {
          Alloc::~Alloc(pAVar9);
          operator_delete(pAVar9,0x48);
          uVar22 = extraout_RDX_06;
        }
      }
    }
    pCVar1 = local_350;
    local_158.write_.shared_alloc_.alloc = (Alloc *)local_2b0._0_8_;
    bVar43 = (Alloc *)local_2b0._0_8_ == (Alloc *)0x0;
    puVar26 = (undefined1 *)CONCAT71(uVar27,bVar43);
    bVar13 = (local_2b0._0_8_ & 7) != 0;
    this = &local_70;
    if (!bVar13 && !bVar43) {
      puVar26 = &entering_parallel;
      if (entering_parallel == '\x01') {
        local_158.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_2b0._0_8_ * 8 + 1);
      }
      else {
        *(int *)(local_2b0._0_8_ + 0x30) = *(int *)(local_2b0._0_8_ + 0x30) + 1;
      }
    }
    local_158.write_.shared_alloc_.direct_ptr = (void *)local_2b0._8_8_;
    HostWrite<int>::write
              ((HostWrite<int> *)&local_80,(int)&local_330,
               (void *)CONCAT71((int7)((ulong)uVar22 >> 8),bVar13 || bVar43),(size_t)puVar26);
    Read<int>::Read(this,&local_80);
    classify_equal_order(local_2c0,(Int)pCVar1,&local_158,(Read<int> *)this);
    pAVar9 = local_70.write_.shared_alloc_.alloc;
    uVar27 = (undefined7)((ulong)this >> 8);
    if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
        local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar29 = &(local_70.write_.shared_alloc_.alloc)->use_count;
      *piVar29 = *piVar29 + -1;
      if (*piVar29 == 0) {
        Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
        operator_delete(pAVar9,0x48);
      }
    }
    pAVar9 = local_80.shared_alloc_.alloc;
    if (((ulong)local_80.shared_alloc_.alloc & 7) == 0 &&
        local_80.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar29 = &(local_80.shared_alloc_.alloc)->use_count;
      *piVar29 = *piVar29 + -1;
      if (*piVar29 == 0) {
        Alloc::~Alloc(local_80.shared_alloc_.alloc);
        operator_delete(pAVar9,0x48);
      }
    }
    pAVar9 = local_158.write_.shared_alloc_.alloc;
    if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
        local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar29 = &(local_158.write_.shared_alloc_.alloc)->use_count;
      *piVar29 = *piVar29 + -1;
      if (*piVar29 == 0) {
        Alloc::~Alloc(pAVar9);
        operator_delete(pAVar9,0x48);
      }
    }
    uVar22 = local_2b0._0_8_;
    if ((local_2b0._0_8_ & 7) == 0 && (Alloc *)local_2b0._0_8_ != (Alloc *)0x0) {
      piVar29 = (int *)(local_2b0._0_8_ + 0x30);
      *piVar29 = *piVar29 + -1;
      if (*piVar29 == 0) {
        Alloc::~Alloc((Alloc *)local_2b0._0_8_);
        operator_delete((void *)uVar22,0x48);
      }
    }
    pAVar9 = (Alloc *)CONCAT44(local_330.write_.shared_alloc_.alloc._4_4_,
                               (uint)local_330.write_.shared_alloc_.alloc);
    if (((uint)local_330.write_.shared_alloc_.alloc & 7) == 0 && pAVar9 != (Alloc *)0x0) {
      piVar29 = &pAVar9->use_count;
      *piVar29 = *piVar29 + -1;
      if (*piVar29 == 0) {
        Alloc::~Alloc(pAVar9);
        operator_delete(pAVar9,0x48);
      }
    }
    pAVar9 = (Alloc *)CONCAT44(local_320.write_.shared_alloc_.alloc._4_4_,
                               (uint)local_320.write_.shared_alloc_.alloc);
    bVar43 = ((uint)local_320.write_.shared_alloc_.alloc & 7) != 0;
    pVVar25 = (pointer)CONCAT71(uVar27,bVar43 || pAVar9 == (Alloc *)0x0);
    if (!bVar43 && pAVar9 != (Alloc *)0x0) {
      piVar29 = &pAVar9->use_count;
      *piVar29 = *piVar29 + -1;
      if (*piVar29 == 0) {
        Alloc::~Alloc(pAVar9);
        operator_delete(pAVar9,0x48);
      }
    }
    uVar24 = (long)pCVar1 - 1;
    if ((long)pCVar1 < 1) {
      finalize_classification(local_2c0);
      uVar22 = local_2e8._0_8_;
      if ((local_2e8._0_8_ & 7) == 0 && (Alloc *)local_2e8._0_8_ != (Alloc *)0x0) {
        piVar29 = (int *)(local_2e8._0_8_ + 0x30);
        *piVar29 = *piVar29 + -1;
        if (*piVar29 == 0) {
          Alloc::~Alloc((Alloc *)local_2e8._0_8_);
          operator_delete((void *)uVar22,0x48);
        }
      }
      lVar37 = 0x60;
      do {
        pvVar8 = *(void **)((long)&local_1d0 + lVar37);
        if (pvVar8 != (void *)0x0) {
          operator_delete(pvVar8,*(long *)((long)&uStack_1c0 + lVar37) - (long)pvVar8);
        }
        lVar37 = lVar37 + -0x18;
      } while (lVar37 != 0);
      lVar37 = 0x60;
      do {
        pvVar8 = *(void **)((long)&local_138.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + lVar37);
        if (pvVar8 != (void *)0x0) {
          operator_delete(pvVar8,*(long *)((long)&lStack_120 + lVar37) - (long)pvVar8);
        }
        lVar37 = lVar37 + -0x18;
      } while (lVar37 != 0);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_b8);
      if (local_308.super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_308.
                        super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_308.
                              super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_308.
                              super__Vector_base<Omega_h::Vector<3>,_std::allocator<Omega_h::Vector<3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_138);
      return;
    }
  } while( true );
}

Assistant:

void read_internal(std::istream& stream, Mesh* mesh) {
  seek_line(stream, "$MeshFormat");
  Real format;
  Int file_type;
  Int data_size;
  stream >> format >> file_type >> data_size;
  OMEGA_H_CHECK(file_type == 0 || file_type == 1);
  bool is_binary = (file_type == 1);
  bool needs_swapping = false;
  if (is_binary) {
    eat_newlines(stream);
    int one;
    binary::read_value(stream, one, false);
    if (one != 1) {
      needs_swapping = true;
      binary::swap_bytes(one);
      OMEGA_H_CHECK(one == 1);
    }
  }
  OMEGA_H_CHECK(data_size == sizeof(Real));
  std::vector<std::string> physical_names;
  if (seek_optional_section(stream, "$PhysicalNames")) {
    Int num_physicals;
    read(stream, num_physicals, is_binary, needs_swapping);
    physical_names.reserve(static_cast<std::size_t>(num_physicals));
    eat_newlines(stream);
    for (auto i = 0; i < num_physicals; ++i) {
      Int dim, number;
      read(stream, dim, is_binary, needs_swapping);
      read(stream, number, is_binary, needs_swapping);
      OMEGA_H_CHECK(number == i + 1);
      std::string name;
      stream >> name;
      physical_names.push_back(name.substr(1, name.size() - 2));
    }
  }
  if (seek_optional_section(stream, "$Entities")) {
    read_internal_entities_section(
        *mesh, format, physical_names, stream, is_binary, needs_swapping);
    std::string line;
    std::getline(stream, line);
    // line matches "[ ]*"
    if (!line.empty()) {
      line.erase(std::remove_if(line.begin(), line.end(),
          [](unsigned char c) { return std::isspace(c); }));
    }
    OMEGA_H_CHECK(line.empty());
    std::getline(stream, line);
    OMEGA_H_CHECK(line == "$EndEntities");
  }
  seek_line(stream, "$Nodes");
  std::vector<Vector<3>> node_coords;
  std::map<int, int> node_number_map;
  int nnodes;
  if (format >= 4.0) {
    eat_newlines(stream);
    int num_entity_blocks;
    read(stream, num_entity_blocks, is_binary, needs_swapping);
    read(stream, nnodes, is_binary, needs_swapping);
    node_coords.reserve(std::size_t(nnodes));
    if (format >= 4.1) {
      int node_tag;
      read(stream, node_tag, is_binary, needs_swapping);  // min
      read(stream, node_tag, is_binary, needs_swapping);  // max
      for (int entity_block = 0; entity_block < num_entity_blocks;
           ++entity_block) {
        int class_id, class_dim;
        read(stream, class_dim, is_binary, needs_swapping);
        read(stream, class_id, is_binary, needs_swapping);
        int node_type, num_block_nodes;
        read(stream, node_type, is_binary, needs_swapping);
        read(stream, num_block_nodes, is_binary, needs_swapping);
        for (int block_node = 0; block_node < num_block_nodes; ++block_node) {
          int node_number;
          read(stream, node_number, is_binary, needs_swapping);
          const auto position = int(node_coords.size() + block_node);
          node_number_map[node_number] = position;
        }
        for (int block_node = 0; block_node < num_block_nodes; ++block_node) {
          Vector<3> coords;
          read(stream, coords[0], is_binary, needs_swapping);
          read(stream, coords[1], is_binary, needs_swapping);
          read(stream, coords[2], is_binary, needs_swapping);
          node_coords.push_back(coords);
        }
      }

    } else {
      for (int entity_block = 0; entity_block < num_entity_blocks;
           ++entity_block) {
        int class_id, class_dim;
        read(stream, class_id, is_binary, needs_swapping);
        read(stream, class_dim, is_binary, needs_swapping);
        int node_type, num_block_nodes;
        read(stream, node_type, is_binary, needs_swapping);
        read(stream, num_block_nodes, is_binary, needs_swapping);
        for (int block_node = 0; block_node < num_block_nodes; ++block_node) {
          int node_number;
          read(stream, node_number, is_binary, needs_swapping);
          node_number_map[node_number] = int(node_coords.size());
          Vector<3> coords;
          read(stream, coords[0], is_binary, needs_swapping);
          read(stream, coords[1], is_binary, needs_swapping);
          read(stream, coords[2], is_binary, needs_swapping);
          node_coords.push_back(coords);
        }
      }
    }
  } else {
    stream >> nnodes;
    OMEGA_H_CHECK(nnodes >= 0);
    node_coords.reserve(std::size_t(nnodes));
    eat_newlines(stream);
    for (LO i = 0; i < nnodes; ++i) {
      LO number;
      read(stream, number, is_binary, needs_swapping);
      // the documentation says numbers don't have to be linear,
      // but so far they have been and assuming they are saves
      // me a big lookup structure (e.g. std::map)
      OMEGA_H_CHECK(number == i + 1);
      Vector<3> coords;
      read(stream, coords[0], is_binary, needs_swapping);
      read(stream, coords[1], is_binary, needs_swapping);
      read(stream, coords[2], is_binary, needs_swapping);
      node_coords.push_back(coords);
    }
  }
  seek_line(stream, "$Elements");
  std::array<std::vector<int>, 4> ent_class_ids;
  std::array<std::vector<int>, 4> ent_nodes;
  Omega_h_Family family = OMEGA_H_SIMPLEX;
  if (format >= 4.0) {
    eat_newlines(stream);
    int num_entity_blocks, total_num_ents;
    read(stream, num_entity_blocks, is_binary, needs_swapping);
    read(stream, total_num_ents, is_binary, needs_swapping);
    if (format >= 4.1) {
      int element_tag;
      read(stream, element_tag, is_binary, needs_swapping);  // min
      read(stream, element_tag, is_binary, needs_swapping);  // max
    }
    for (int entity_block = 0; entity_block < num_entity_blocks;
         ++entity_block) {
      int class_id, class_dim;
      if (format == 4.) {
        read(stream, class_id, is_binary, needs_swapping);
        read(stream, class_dim, is_binary, needs_swapping);
      } else {
        read(stream, class_dim, is_binary, needs_swapping);
        read(stream, class_id, is_binary, needs_swapping);
      }
      int ent_type, num_block_ents;
      read(stream, ent_type, is_binary, needs_swapping);
      read(stream, num_block_ents, is_binary, needs_swapping);
      Int dim = type_dim(ent_type);
      OMEGA_H_CHECK(dim == class_dim);
      if (type_family(ent_type) == OMEGA_H_HYPERCUBE) {
        family = OMEGA_H_HYPERCUBE;
      }
      int nodes_per_ent = element_degree(family, dim, 0);
      ent_class_ids[dim].reserve(
          ent_class_ids[dim].size() + std::size_t(num_block_ents));
      ent_nodes[dim].reserve(
          ent_nodes[dim].size() + std::size_t(num_block_ents * nodes_per_ent));
      for (int block_ent = 0; block_ent < num_block_ents; ++block_ent) {
        ent_class_ids[dim].push_back(class_id);
        int ent_number;
        read(stream, ent_number, is_binary, needs_swapping);
        for (int ent_node = 0; ent_node < nodes_per_ent; ++ent_node) {
          int node_number;
          read(stream, node_number, is_binary, needs_swapping);
          auto it = node_number_map.find(node_number);
          OMEGA_H_CHECK(it != node_number_map.end());
          ent_nodes[dim].push_back(it->second);
        }
      }
    }

  } else {
    LO nents;
    stream >> nents;
    OMEGA_H_CHECK(nents >= 0);
    std::array<std::unordered_map<Int, Int>, 4> ent2physical;
    if (is_binary) {
      eat_newlines(stream);
      LO i = 0;
      while (i < nents) {
        I32 type, nfollow, ntags;
        binary::read_value(stream, type, needs_swapping);
        binary::read_value(stream, nfollow, needs_swapping);
        binary::read_value(stream, ntags, needs_swapping);
        Int dim = type_dim(type);
        if (type_family(type) == OMEGA_H_HYPERCUBE) {
          family = OMEGA_H_HYPERCUBE;
        }
        Int neev = element_degree(family, dim, 0);
        OMEGA_H_CHECK(ntags >= 2);
        for (Int j = 0; j < nfollow; ++j, ++i) {
          I32 number, physical, elementary;
          binary::read_value(stream, number, needs_swapping);
          binary::read_value(stream, physical, needs_swapping);
          binary::read_value(stream, elementary, needs_swapping);
          ent_class_ids[dim].push_back(elementary);
          if (physical != 0) {
            ent2physical[dim].emplace(elementary, physical);
          }
          for (Int k = 2; k < ntags; ++k) {
            I32 ignored;
            binary::read_value(stream, ignored, false);
          }
          for (Int k = 0; k < neev; ++k) {
            I32 node_number;
            binary::read_value(stream, node_number, needs_swapping);
            ent_nodes[dim].push_back(node_number - 1);
          }
        }
      }
    } else {
      for (LO i = 0; i < nents; ++i) {
        LO number;
        stream >> number;
        OMEGA_H_CHECK(number > 0);
        Int type;
        stream >> type;
        Int dim = type_dim(type);
        if (type_family(type) == OMEGA_H_HYPERCUBE) family = OMEGA_H_HYPERCUBE;
        Int ntags;
        stream >> ntags;
        OMEGA_H_CHECK(ntags >= 2);
        Int physical, elementary;
        stream >> physical >> elementary;
        ent_class_ids[dim].push_back(elementary);
        if (physical != 0) {
          ent2physical[dim].emplace(elementary, physical);
        }
        Int tag;
        for (Int j = 2; j < ntags; ++j) {
          stream >> tag;
        }
        Int neev = dim + 1;
        LO node_number;
        for (Int j = 0; j < neev; ++j) {
          stream >> node_number;
          ent_nodes[dim].push_back(node_number - 1);
        }
      }
    }
    for (Int dim = 0; dim < static_cast<Int>(ent2physical.size()); ++dim) {
      const auto& entities = ent2physical[dim];
      for (const auto& pair : entities) {
        const auto entity = pair.first;
        const auto physical = pair.second;
        std::string physical_name(std::to_string(physical));
        if (physical <= static_cast<Int>(physical_names.size())) {
          physical_name = physical_names[physical - 1];
        }
        mesh->class_sets[physical_name].emplace_back(dim, entity);
      }
    }
  }
  Int max_dim;
  if (ent_nodes[3].size()) {
    max_dim = 3;
  } else if (ent_nodes[2].size()) {
    max_dim = 2;
  } else if (ent_nodes[1].size()) {
    max_dim = 1;
  } else {
    Omega_h_fail("There were no Elements of dimension higher than zero!\n");
  }
  HostWrite<Real> host_coords(nnodes * max_dim);
  for (LO i = 0; i < nnodes; ++i) {
    for (Int j = 0; j < max_dim; ++j) {
      host_coords[i * max_dim + j] =
          node_coords[static_cast<std::size_t>(i)][j];
    }
  }
  for (Int ent_dim = max_dim; ent_dim >= 0; --ent_dim) {
    Int neev = element_degree(family, ent_dim, VERT);
    LO ndim_ents = static_cast<LO>(ent_nodes[ent_dim].size()) / neev;
    HostWrite<LO> host_ev2v(ndim_ents * neev);
    HostWrite<LO> host_class_id(ndim_ents);
    for (LO i = 0; i < ndim_ents; ++i) {
      for (Int j = 0; j < neev; ++j) {
        host_ev2v[i * neev + j] =
            ent_nodes[ent_dim][static_cast<std::size_t>(i * neev + j)];
      }
      host_class_id[i] = ent_class_ids[ent_dim][static_cast<std::size_t>(i)];
    }
    auto eqv2v = Read<LO>(host_ev2v.write());
    if (ent_dim == max_dim) {
      build_from_elems_and_coords(
          mesh, family, max_dim, eqv2v, host_coords.write());
    }
    classify_equal_order(mesh, ent_dim, eqv2v, host_class_id.write());
  }
  finalize_classification(mesh);
}